

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::DistConstraintListSyntax::DistConstraintListSyntax
          (DistConstraintListSyntax *this,Token dist,Token openBrace,
          SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *items,Token closeBrace)

{
  undefined4 uVar1;
  bool bVar2;
  DistItemBaseSyntax *pDVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  undefined8 in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  DistItemBaseSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *in_stack_ffffffffffffff88;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *this_00;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)&stack0x00000008;
  SyntaxNode::SyntaxNode(in_RDI,DistConstraintList);
  *(undefined8 *)(in_RDI + 1) = in_RSI;
  in_RDI[1].parent = in_RDX;
  in_RDI[1].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 2) = in_R8;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff88);
  in_RDI[4].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[5].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[5].field_0x4 = uVar1;
  *(SyntaxNode **)(in_RDI + 3) = in_RDI;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)0x416a6a);
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::end(this_00);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::DistItemBaseSyntax_*> *)
                       in_stack_ffffffffffffff88);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
                          *)0x416aa9);
    (pDVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

DistConstraintListSyntax(Token dist, Token openBrace, const SeparatedSyntaxList<DistItemBaseSyntax>& items, Token closeBrace) :
        SyntaxNode(SyntaxKind::DistConstraintList), dist(dist), openBrace(openBrace), items(items), closeBrace(closeBrace) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }